

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_2_5::minEigenVector<Imath_2_5::Matrix44<float>,Imath_2_5::Vec4<float>>
               (Matrix44<float> *A,Vec4<float> *V)

{
  uint uVar1;
  float *pfVar2;
  Vec4<float> *in_RSI;
  Vec4<float> *pVVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  uint i_1;
  uint i;
  int minIdx;
  Matrix44<float> MV;
  Vec4<float> S;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float fVar4;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff9c;
  uint i_00;
  Matrix44<float> *in_stack_ffffffffffffffa0;
  Vec4<float> local_20;
  Vec4<float> *local_10;
  
  local_10 = in_RSI;
  Vec4<float>::Vec4(&local_20);
  Matrix44<float>::Matrix44
            ((Matrix44<float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  jacobiEigenSolver<float>
            (in_stack_ffffffffffffffa0,
             (Vec4<float> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (Matrix44<float> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  i_00 = 0;
  uVar6 = 1;
  while( true ) {
    uVar5 = uVar6;
    uVar1 = Vec4<float>::dimensions();
    if (uVar1 <= uVar6) break;
    pVVar3 = &local_20;
    Vec4<float>::operator[](pVVar3,uVar5);
    std::abs((int)pVVar3);
    pVVar3 = &local_20;
    Vec4<float>::operator[](pVVar3,i_00);
    std::abs((int)pVVar3);
    if (extraout_XMM0_Da < extraout_XMM0_Da_00) {
      i_00 = uVar5;
    }
    uVar6 = uVar5 + 1;
  }
  uVar6 = 0;
  while( true ) {
    uVar5 = uVar6;
    uVar1 = Vec4<float>::dimensions();
    if (uVar1 <= uVar6) break;
    pfVar2 = Matrix44<float>::operator[]((Matrix44<float> *)&stack0xffffffffffffffa0,uVar5);
    fVar4 = pfVar2[(int)i_00];
    pfVar2 = Vec4<float>::operator[](local_10,uVar5);
    *pfVar2 = fVar4;
    uVar6 = uVar5 + 1;
  }
  return;
}

Assistant:

void
minEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver(A, S, MV);

    int minIdx(0);
    for(unsigned int i = 1; i < TV::dimensions(); ++i)
    {
        if(std::abs(S[i]) < std::abs(S[minIdx]))
            minIdx = i;
    }

   for(unsigned int i = 0; i < TV::dimensions(); ++i)
        V[i] = MV[i][minIdx];
}